

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_compare.cpp
# Opt level: O2

void __thiscall
ktx::CommandCompare::compareDFDBasic
          (CommandCompare *this,PrintDiff *diff,uint32_t blockIndex,optional<ktx::BDFD> *bdfds,
          optional<std::vector<ktx::SampleType,_std::allocator<ktx::SampleType>_>_> *bdfdSamples)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  long lVar3;
  ulong uVar4;
  undefined1 auVar5 [8];
  pointer pcVar6;
  optional<std::vector<ktx::SampleType,_std::allocator<ktx::SampleType>_>_> *poVar7;
  bool *pbVar8;
  long lVar9;
  uint uVar10;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  aVar11;
  pointer pcVar12;
  _Alloc_hider _Var13;
  bool bVar14;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  string_view fmt_03;
  string_view fmt_04;
  string_view fmt_05;
  string_view fmt_06;
  string_view fmt_07;
  string_view fmt_08;
  string_view fmt_09;
  string_view fmt_10;
  string_view fmt_11;
  string_view fmt_12;
  string_view fmt_13;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  format_args args_04;
  format_args args_05;
  format_args args_06;
  format_args args_07;
  format_args args_08;
  format_args args_09;
  format_args args_10;
  format_args args_11;
  format_args args_12;
  format_args args_13;
  string_view textHeaderIn;
  string_view textHeaderIn_00;
  string_view textHeaderIn_01;
  string_view textHeaderIn_02;
  string_view textHeaderIn_03;
  string_view textHeaderIn_04;
  string_view textHeaderIn_05;
  string_view textHeaderIn_06;
  string_view textHeaderIn_07;
  string_view textHeaderIn_08;
  string_view textHeaderIn_09;
  string_view jsonPathIn;
  string_view jsonPathIn_00;
  string_view jsonPathIn_01;
  string_view jsonPathIn_02;
  string_view jsonPathIn_03;
  string_view jsonPathIn_04;
  string_view jsonPathIn_05;
  string_view jsonPathIn_06;
  string_view jsonPathIn_07;
  string_view jsonPathIn_08;
  string_view jsonPathIn_09;
  string_view jsonPathIn_10;
  string_view jsonPathIn_11;
  optional<ktx::SampleType> samples [2];
  undefined1 local_15c [16];
  bool local_14c;
  optional<ktx::BDFD> *bdfds_local;
  undefined1 local_140 [8];
  uint local_138;
  uint uStack_134;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_130;
  _Alloc_hider local_120;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  lengthAndOffset [2];
  _Storage<int,_true> local_c0;
  undefined1 local_bc;
  optional<unsigned_int> qualifierFlags [2];
  undefined1 local_a8 [96];
  optional<std::vector<ktx::SampleType,_std::allocator<ktx::SampleType>_>_> *local_48;
  PrintDiff *local_40;
  pointer local_38;
  
  bdfds_local = bdfds;
  if (((bdfds->super__Optional_base<ktx::BDFD,_true,_true>)._M_payload.
       super__Optional_payload_base<ktx::BDFD>._M_engaged ==
       (bdfdSamples->
       super__Optional_base<std::vector<ktx::SampleType,_std::allocator<ktx::SampleType>_>,_false,_false>
       )._M_payload.
       super__Optional_payload<std::vector<ktx::SampleType,_std::allocator<ktx::SampleType>_>,_true,_false,_false>
       .
       super__Optional_payload_base<std::vector<ktx::SampleType,_std::allocator<ktx::SampleType>_>_>
       ._M_engaged) &&
     (bdfds[1].super__Optional_base<ktx::BDFD,_true,_true>._M_payload.
      super__Optional_payload_base<ktx::BDFD>._M_engaged ==
      bdfdSamples[1].
      super__Optional_base<std::vector<ktx::SampleType,_std::allocator<ktx::SampleType>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::vector<ktx::SampleType,_std::allocator<ktx::SampleType>_>,_true,_false,_false>
      .super__Optional_payload_base<std::vector<ktx::SampleType,_std::allocator<ktx::SampleType>_>_>
      ._M_engaged)) {
    pcVar12 = (pointer)(ulong)blockIndex;
    if ((this->options).super_OptionsCompare.ignoreDFD != all_except_color_space) {
      fmt.size_ = 2;
      fmt.data_ = (char *)0x25;
      args.field_1.values_ = in_R9.values_;
      args.desc_ = (unsigned_long_long)samples;
      samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
      super__Optional_payload_base<ktx::SampleType>._M_payload._0_8_ = pcVar12;
      ::fmt::v10::vformat_abi_cxx11_
                ((string *)lengthAndOffset,(v10 *)"/dataFormatDescriptor/blocks/{}/flags",fmt,args);
      if ((bdfds_local->super__Optional_base<ktx::BDFD,_true,_true>)._M_payload.
          super__Optional_payload_base<ktx::BDFD>._M_engaged == false) {
        samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
        super__Optional_payload_base<ktx::SampleType>._M_payload._4_1_ = 0;
      }
      else {
        samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
        super__Optional_payload_base<ktx::SampleType>._M_payload._1_3_ = 0;
        samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
        super__Optional_payload_base<ktx::SampleType>._M_payload._0_1_ =
             *(byte *)((long)&(bdfds_local->super__Optional_base<ktx::BDFD,_true,_true>)._M_payload.
                              super__Optional_payload_base<ktx::BDFD>._M_payload + 0xb);
        samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
        super__Optional_payload_base<ktx::SampleType>._M_payload._4_1_ = 1;
      }
      if (bdfds_local[1].super__Optional_base<ktx::BDFD,_true,_true>._M_payload.
          super__Optional_payload_base<ktx::BDFD>._M_engaged == false) {
        local_140[4] = 0;
      }
      else {
        local_140._1_3_ = 0;
        local_140[0] = *(byte *)((long)&bdfds_local[1].super__Optional_base<ktx::BDFD,_true,_true>.
                                        _M_payload.super__Optional_payload_base<ktx::BDFD>.
                                        _M_payload + 0xb);
        local_140[4] = 1;
      }
      in_R9.values_ = (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)samples;
      textHeaderIn._M_str = "Flags";
      textHeaderIn._M_len = 5;
      jsonPathIn._M_str =
           (char *)lengthAndOffset[0].
                   super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                   ._M_payload.
                   super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                   .
                   super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ._M_payload._0_8_;
      jsonPathIn._M_len =
           lengthAndOffset[0].
           super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
           ._M_payload.
           super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
           .
           super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ._M_payload._M_value._M_string_length;
      DiffFlags::DiffFlags
                ((DiffFlags *)local_a8,textHeaderIn,jsonPathIn,
                 (optional<unsigned_int> *)in_R9.values_,(optional<unsigned_int> *)local_140,
                 dfdToStringFlagsBit);
      PrintDiff::operator<<(diff,(DiffBase<unsigned_int> *)local_a8);
      std::__cxx11::string::~string((string *)lengthAndOffset);
    }
    fmt_00.size_ = 2;
    fmt_00.data_ = (char *)0x30;
    args_00.field_1.values_ = in_R9.values_;
    args_00.desc_ = (unsigned_long_long)samples;
    samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
    super__Optional_payload_base<ktx::SampleType>._M_payload._0_8_ = pcVar12;
    ::fmt::v10::vformat_abi_cxx11_
              ((string *)lengthAndOffset,(v10 *)"/dataFormatDescriptor/blocks/{}/transferFunction",
               fmt_00,args_00);
    auVar5 = local_140;
    bVar14 = (bdfds_local->super__Optional_base<ktx::BDFD,_true,_true>)._M_payload.
             super__Optional_payload_base<ktx::BDFD>._M_engaged == true;
    if (bVar14) {
      local_140._1_3_ = 0;
      local_140[0] = *(byte *)((long)&(bdfds_local->super__Optional_base<ktx::BDFD,_true,_true>).
                                      _M_payload.super__Optional_payload_base<ktx::BDFD>._M_payload
                              + 10);
      local_140._4_4_ = auVar5._4_4_;
    }
    local_140[4] = bVar14;
    bVar14 = bdfds_local[1].super__Optional_base<ktx::BDFD,_true,_true>._M_payload.
             super__Optional_payload_base<ktx::BDFD>._M_engaged == true;
    if (bVar14) {
      local_15c._1_3_ = 0;
      local_15c[0] = *(byte *)((long)&bdfds_local[1].super__Optional_base<ktx::BDFD,_true,_true>.
                                      _M_payload.super__Optional_payload_base<ktx::BDFD>._M_payload
                              + 10);
    }
    samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
    super__Optional_payload_base<ktx::SampleType>._M_payload._8_8_ = 0;
    samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
    super__Optional_payload_base<ktx::SampleType>._M_payload._0_8_ = &bdfds_local;
    samples[1].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
    super__Optional_payload_base<ktx::SampleType>._M_payload._4_4_ = 0x12d6b4;
    samples[1].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
    super__Optional_payload_base<ktx::SampleType>._M_payload._M_value.lower = 0;
    samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
    super__Optional_payload_base<ktx::SampleType>._M_engaged = true;
    samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
    super__Optional_payload_base<ktx::SampleType>._17_3_ = 0x12d6;
    samples[1].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
    super__Optional_payload_base<ktx::SampleType>._M_payload._0_2_ = 0;
    samples[1].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
    super__Optional_payload_base<ktx::SampleType>._M_payload._2_1_ = 0;
    samples[1].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
    super__Optional_payload_base<ktx::SampleType>._M_payload._3_1_ = 0;
    aVar11.values_ = (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)local_140;
    textHeaderIn_00._M_str = "Transfer";
    textHeaderIn_00._M_len = 8;
    jsonPathIn_00._M_str =
         (char *)lengthAndOffset[0].
                 super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                 ._M_payload.
                 super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                 .
                 super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ._M_payload._0_8_;
    jsonPathIn_00._M_len =
         lengthAndOffset[0].
         super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
         ._M_payload.
         super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
         .
         super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ._M_payload._M_value._M_string_length;
    local_15c[4] = bVar14;
    DiffEnum<_khr_df_transfer_e>::DiffEnum
              ((DiffEnum<_khr_df_transfer_e> *)local_a8,textHeaderIn_00,jsonPathIn_00,
               (optional<int> *)aVar11.values_,(optional<int> *)local_15c,
               (function<const_char_*(unsigned_long)> *)samples);
    PrintDiff::operator<<(diff,(DiffBase<_khr_df_transfer_e> *)local_a8);
    std::_Function_base::~_Function_base((_Function_base *)samples);
    std::__cxx11::string::~string((string *)lengthAndOffset);
    fmt_01.size_ = 2;
    fmt_01.data_ = (char *)0x2e;
    args_01.field_1.values_ = aVar11.values_;
    args_01.desc_ = (unsigned_long_long)samples;
    samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
    super__Optional_payload_base<ktx::SampleType>._M_payload._0_8_ = pcVar12;
    ::fmt::v10::vformat_abi_cxx11_
              ((string *)lengthAndOffset,(v10 *)"/dataFormatDescriptor/blocks/{}/colorPrimaries",
               fmt_01,args_01);
    auVar5 = local_140;
    bVar14 = (bdfds_local->super__Optional_base<ktx::BDFD,_true,_true>)._M_payload.
             super__Optional_payload_base<ktx::BDFD>._M_engaged == true;
    if (bVar14) {
      local_140._1_3_ = 0;
      local_140[0] = *(byte *)((long)&(bdfds_local->super__Optional_base<ktx::BDFD,_true,_true>).
                                      _M_payload.super__Optional_payload_base<ktx::BDFD>._M_payload
                              + 9);
      local_140._4_4_ = auVar5._4_4_;
    }
    local_140[4] = bVar14;
    local_15c[4] = bdfds_local[1].super__Optional_base<ktx::BDFD,_true,_true>._M_payload.
                   super__Optional_payload_base<ktx::BDFD>._M_engaged == true;
    if ((bool)local_15c[4]) {
      local_15c._1_3_ = 0;
      local_15c[0] = *(byte *)((long)&bdfds_local[1].super__Optional_base<ktx::BDFD,_true,_true>.
                                      _M_payload.super__Optional_payload_base<ktx::BDFD>._M_payload
                              + 9);
    }
    samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
    super__Optional_payload_base<ktx::SampleType>._M_payload._8_8_ = 0;
    samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
    super__Optional_payload_base<ktx::SampleType>._M_payload._0_8_ = &bdfds_local;
    samples[1].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
    super__Optional_payload_base<ktx::SampleType>._M_payload._4_4_ = 0x12d6ee;
    samples[1].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
    super__Optional_payload_base<ktx::SampleType>._M_payload._M_value.lower = 0;
    samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
    super__Optional_payload_base<ktx::SampleType>._M_engaged = true;
    samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
    super__Optional_payload_base<ktx::SampleType>._17_3_ = 0x12d7;
    samples[1].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
    super__Optional_payload_base<ktx::SampleType>._M_payload._0_2_ = 0;
    samples[1].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
    super__Optional_payload_base<ktx::SampleType>._M_payload._2_1_ = 0;
    samples[1].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
    super__Optional_payload_base<ktx::SampleType>._M_payload._3_1_ = 0;
    aVar11.values_ = (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)local_140;
    textHeaderIn_01._M_str = "Primaries";
    textHeaderIn_01._M_len = 9;
    jsonPathIn_01._M_str =
         (char *)lengthAndOffset[0].
                 super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                 ._M_payload.
                 super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                 .
                 super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ._M_payload._0_8_;
    jsonPathIn_01._M_len =
         lengthAndOffset[0].
         super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
         ._M_payload.
         super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
         .
         super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ._M_payload._M_value._M_string_length;
    DiffEnum<_khr_df_primaries_e>::DiffEnum
              ((DiffEnum<_khr_df_primaries_e> *)local_a8,textHeaderIn_01,jsonPathIn_01,
               (optional<int> *)aVar11.values_,(optional<int> *)local_15c,
               (function<const_char_*(unsigned_long)> *)samples);
    PrintDiff::operator<<(diff,(DiffBase<_khr_df_primaries_e> *)local_a8);
    std::_Function_base::~_Function_base((_Function_base *)samples);
    std::__cxx11::string::~string((string *)lengthAndOffset);
    if ((this->options).super_OptionsCompare.ignoreDFD != all_except_color_space) {
      fmt_02.size_ = 2;
      fmt_02.data_ = (char *)0x2a;
      args_02.field_1.values_ = aVar11.values_;
      args_02.desc_ = (unsigned_long_long)samples;
      samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
      super__Optional_payload_base<ktx::SampleType>._M_payload._0_8_ = pcVar12;
      ::fmt::v10::vformat_abi_cxx11_
                ((string *)lengthAndOffset,(v10 *)"/dataFormatDescriptor/blocks/{}/colorModel",
                 fmt_02,args_02);
      auVar5 = local_140;
      bVar14 = (bdfds_local->super__Optional_base<ktx::BDFD,_true,_true>)._M_payload.
               super__Optional_payload_base<ktx::BDFD>._M_engaged == true;
      if (bVar14) {
        local_140._1_3_ = 0;
        local_140[0] = *(byte *)((long)&(bdfds_local->super__Optional_base<ktx::BDFD,_true,_true>).
                                        _M_payload.super__Optional_payload_base<ktx::BDFD>.
                                        _M_payload + 8);
        local_140._4_4_ = auVar5._4_4_;
      }
      local_140[4] = bVar14;
      local_15c[4] = bdfds_local[1].super__Optional_base<ktx::BDFD,_true,_true>._M_payload.
                     super__Optional_payload_base<ktx::BDFD>._M_engaged == true;
      if ((bool)local_15c[4]) {
        local_15c._1_3_ = 0;
        local_15c[0] = *(byte *)((long)&bdfds_local[1].super__Optional_base<ktx::BDFD,_true,_true>.
                                        _M_payload.super__Optional_payload_base<ktx::BDFD>.
                                        _M_payload + 8);
      }
      samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
      super__Optional_payload_base<ktx::SampleType>._M_payload._8_8_ = 0;
      samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
      super__Optional_payload_base<ktx::SampleType>._M_payload._0_8_ = &bdfds_local;
      samples[1].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
      super__Optional_payload_base<ktx::SampleType>._M_payload._4_4_ = 0x12d728;
      samples[1].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
      super__Optional_payload_base<ktx::SampleType>._M_payload._M_value.lower = 0;
      samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
      super__Optional_payload_base<ktx::SampleType>._M_engaged = true;
      samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
      super__Optional_payload_base<ktx::SampleType>._17_3_ = 0x12d7;
      samples[1].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
      super__Optional_payload_base<ktx::SampleType>._M_payload._0_2_ = 0;
      samples[1].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
      super__Optional_payload_base<ktx::SampleType>._M_payload._2_1_ = 0;
      samples[1].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
      super__Optional_payload_base<ktx::SampleType>._M_payload._3_1_ = 0;
      textHeaderIn_02._M_str = "Model";
      textHeaderIn_02._M_len = 5;
      jsonPathIn_02._M_str =
           (char *)lengthAndOffset[0].
                   super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                   ._M_payload.
                   super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                   .
                   super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ._M_payload._0_8_;
      jsonPathIn_02._M_len =
           lengthAndOffset[0].
           super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
           ._M_payload.
           super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
           .
           super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ._M_payload._M_value._M_string_length;
      aVar11.values_ = (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)local_140
      ;
      DiffEnum<_khr_df_model_e>::DiffEnum
                ((DiffEnum<_khr_df_model_e> *)local_a8,textHeaderIn_02,jsonPathIn_02,
                 (optional<int> *)local_140,(optional<int> *)local_15c,
                 (function<const_char_*(unsigned_long)> *)samples);
      PrintDiff::operator<<(diff,(DiffBase<_khr_df_model_e> *)local_a8);
      std::_Function_base::~_Function_base((_Function_base *)samples);
      std::__cxx11::string::~string((string *)lengthAndOffset);
      fmt_03.size_ = 2;
      fmt_03.data_ = (char *)0x33;
      args_03.field_1.values_ = aVar11.values_;
      args_03.desc_ = (unsigned_long_long)samples;
      samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
      super__Optional_payload_base<ktx::SampleType>._M_payload._0_8_ = pcVar12;
      ::fmt::v10::vformat_abi_cxx11_
                ((string *)lengthAndOffset,
                 (v10 *)"/dataFormatDescriptor/blocks/{}/texelBlockDimension",fmt_03,args_03);
      bVar14 = (bdfds_local->super__Optional_base<ktx::BDFD,_true,_true>)._M_payload.
               super__Optional_payload_base<ktx::BDFD>._M_engaged == true;
      if (bVar14) {
        uVar2 = *(undefined8 *)
                 ((long)&(bdfds_local->super__Optional_base<ktx::BDFD,_true,_true>)._M_payload.
                         super__Optional_payload_base<ktx::BDFD>._M_payload + 8);
        uVar10 = (uint)((ulong)uVar2 >> 0x20);
        samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
        super__Optional_payload_base<ktx::SampleType>._M_payload._0_8_ =
             CONCAT44(uVar10 >> 8,uVar10) & 0xff000000ff;
        samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
        super__Optional_payload_base<ktx::SampleType>._M_payload._M_value.upper._1_3_ = 0;
        samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
        super__Optional_payload_base<ktx::SampleType>._M_payload._8_5_ =
             CONCAT14((char)((ulong)uVar2 >> 0x38),(uint)(ushort)((ulong)uVar2 >> 0x30)) &
             0xff000000ff;
      }
      samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
      super__Optional_payload_base<ktx::SampleType>._M_engaged = bVar14;
      local_130._M_local_buf[0] =
           bdfds_local[1].super__Optional_base<ktx::BDFD,_true,_true>._M_payload.
           super__Optional_payload_base<ktx::BDFD>._M_engaged == true;
      if ((bool)local_130._M_local_buf[0]) {
        uVar2 = *(undefined8 *)
                 ((long)&bdfds_local[1].super__Optional_base<ktx::BDFD,_true,_true>._M_payload.
                         super__Optional_payload_base<ktx::BDFD>._M_payload + 8);
        uVar10 = (uint)((ulong)uVar2 >> 0x20);
        local_138 = (ushort)((ulong)uVar2 >> 0x30) & 0xff;
        local_140 = (undefined1  [8])(CONCAT44(uVar10 >> 8,uVar10) & 0xff000000ff);
        uStack_134 = (uint)(byte)((ulong)uVar2 >> 0x38);
      }
      aVar11.values_ = (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)samples;
      textHeaderIn_03._M_str = "Dimensions";
      textHeaderIn_03._M_len = 10;
      jsonPathIn_03._M_str =
           (char *)lengthAndOffset[0].
                   super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                   ._M_payload.
                   super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                   .
                   super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ._M_payload._0_8_;
      jsonPathIn_03._M_len =
           lengthAndOffset[0].
           super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
           ._M_payload.
           super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
           .
           super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ._M_payload._M_value._M_string_length;
      DiffArray<unsigned_int,_4UL>::DiffArray
                ((DiffArray<unsigned_int,_4UL> *)local_a8,textHeaderIn_03,jsonPathIn_03,
                 (optional<std::array<unsigned_int,_4UL>_> *)aVar11.values_,
                 (optional<std::array<unsigned_int,_4UL>_> *)local_140);
      PrintDiff::operator<<(diff,(DiffBase<std::array<unsigned_int,_4UL>_> *)local_a8);
      std::__cxx11::string::~string((string *)lengthAndOffset);
      if ((this->options).super_OptionsCompare.ignoreBDFDBytesPlane == false) {
        fmt_04.size_ = 2;
        fmt_04.data_ = (char *)0x2a;
        args_04.field_1.values_ = aVar11.values_;
        args_04.desc_ = (unsigned_long_long)samples;
        samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
        super__Optional_payload_base<ktx::SampleType>._M_payload._0_8_ = pcVar12;
        ::fmt::v10::vformat_abi_cxx11_
                  ((string *)lengthAndOffset,(v10 *)"/dataFormatDescriptor/blocks/{}/bytesPlane",
                   fmt_04,args_04);
        bVar14 = (bdfds_local->super__Optional_base<ktx::BDFD,_true,_true>)._M_payload.
                 super__Optional_payload_base<ktx::BDFD>._M_engaged == true;
        if (bVar14) {
          samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
          super__Optional_payload_base<ktx::SampleType>._M_payload._0_8_ =
               *(undefined8 *)
                (bdfds_local->super__Optional_base<ktx::BDFD,_true,_true>)._M_payload.
                super__Optional_payload_base<ktx::BDFD>._M_payload._M_value.bytesPlanes._M_elems;
        }
        samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
        super__Optional_payload_base<ktx::SampleType>._M_payload._M_value.lower._0_1_ = bVar14;
        bVar14 = bdfds_local[1].super__Optional_base<ktx::BDFD,_true,_true>._M_payload.
                 super__Optional_payload_base<ktx::BDFD>._M_engaged == true;
        if (bVar14) {
          local_140 = *(undefined1 (*) [8])
                       bdfds_local[1].super__Optional_base<ktx::BDFD,_true,_true>._M_payload.
                       super__Optional_payload_base<ktx::BDFD>._M_payload._M_value.bytesPlanes.
                       _M_elems;
        }
        local_138 = CONCAT31(local_138._1_3_,bVar14);
        aVar11.values_ = (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)samples
        ;
        textHeaderIn_04._M_str = "Plane bytes";
        textHeaderIn_04._M_len = 0xb;
        jsonPathIn_04._M_str =
             (char *)lengthAndOffset[0].
                     super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                     ._M_payload.
                     super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                     .
                     super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ._M_payload._0_8_;
        jsonPathIn_04._M_len =
             lengthAndOffset[0].
             super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
             ._M_payload.
             super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
             .
             super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ._M_payload._M_value._M_string_length;
        DiffArray<unsigned_char,_8UL>::DiffArray
                  ((DiffArray<unsigned_char,_8UL> *)local_a8,textHeaderIn_04,jsonPathIn_04,
                   (optional<std::array<unsigned_char,_8UL>_> *)aVar11.values_,
                   (optional<std::array<unsigned_char,_8UL>_> *)local_140);
        PrintDiff::operator<<(diff,(DiffBase<std::array<unsigned_char,_8UL>_> *)local_a8);
        std::__cxx11::string::~string((string *)lengthAndOffset);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_a8,"Sample <i>:\n",(allocator<char> *)lengthAndOffset);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&diff->context
                 ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8);
      std::__cxx11::string::~string((string *)local_a8);
      if ((bdfdSamples->
          super__Optional_base<std::vector<ktx::SampleType,_std::allocator<ktx::SampleType>_>,_false,_false>
          )._M_payload.
          super__Optional_payload<std::vector<ktx::SampleType,_std::allocator<ktx::SampleType>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::vector<ktx::SampleType,_std::allocator<ktx::SampleType>_>_>
          ._M_engaged == true) {
        pcVar6 = (pointer)((long)*(pointer *)
                                  ((long)&(bdfdSamples->
                                          super__Optional_base<std::vector<ktx::SampleType,_std::allocator<ktx::SampleType>_>,_false,_false>
                                          )._M_payload.
                                          super__Optional_payload<std::vector<ktx::SampleType,_std::allocator<ktx::SampleType>_>,_true,_false,_false>
                                          .
                                          super__Optional_payload_base<std::vector<ktx::SampleType,_std::allocator<ktx::SampleType>_>_>
                                          ._M_payload._M_value.
                                          super__Vector_base<ktx::SampleType,_std::allocator<ktx::SampleType>_>
                                          ._M_impl + 8) -
                           *(long *)&(bdfdSamples->
                                     super__Optional_base<std::vector<ktx::SampleType,_std::allocator<ktx::SampleType>_>,_false,_false>
                                     )._M_payload.
                                     super__Optional_payload<std::vector<ktx::SampleType,_std::allocator<ktx::SampleType>_>,_true,_false,_false>
                                     .
                                     super__Optional_payload_base<std::vector<ktx::SampleType,_std::allocator<ktx::SampleType>_>_>
                                     ._M_payload._M_value.
                                     super__Vector_base<ktx::SampleType,_std::allocator<ktx::SampleType>_>
                                     ._M_impl >> 4);
      }
      else {
        pcVar6 = (pointer)0x0;
      }
      if (bdfdSamples[1].
          super__Optional_base<std::vector<ktx::SampleType,_std::allocator<ktx::SampleType>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::vector<ktx::SampleType,_std::allocator<ktx::SampleType>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::vector<ktx::SampleType,_std::allocator<ktx::SampleType>_>_>
          ._M_engaged == true) {
        local_38 = (pointer)((long)*(pointer *)
                                    ((long)&bdfdSamples[1].
                                            super__Optional_base<std::vector<ktx::SampleType,_std::allocator<ktx::SampleType>_>,_false,_false>
                                            ._M_payload.
                                            super__Optional_payload<std::vector<ktx::SampleType,_std::allocator<ktx::SampleType>_>,_true,_false,_false>
                                            .
                                            super__Optional_payload_base<std::vector<ktx::SampleType,_std::allocator<ktx::SampleType>_>_>
                                            ._M_payload._M_value.
                                            super__Vector_base<ktx::SampleType,_std::allocator<ktx::SampleType>_>
                                            ._M_impl + 8) -
                             *(long *)&bdfdSamples[1].
                                       super__Optional_base<std::vector<ktx::SampleType,_std::allocator<ktx::SampleType>_>,_false,_false>
                                       ._M_payload.
                                       super__Optional_payload<std::vector<ktx::SampleType,_std::allocator<ktx::SampleType>_>,_true,_false,_false>
                                       .
                                       super__Optional_payload_base<std::vector<ktx::SampleType,_std::allocator<ktx::SampleType>_>_>
                                       ._M_payload._M_value.
                                       super__Vector_base<ktx::SampleType,_std::allocator<ktx::SampleType>_>
                                       ._M_impl >> 4);
      }
      else {
        local_38 = (pointer)0x0;
      }
      if (local_38 < pcVar6) {
        local_38 = pcVar6;
      }
      local_120._M_p = pcVar12;
      local_48 = bdfdSamples;
      local_40 = diff;
      for (_Var13._M_p = (pointer)0x0; _Var13._M_p != local_38; _Var13._M_p = _Var13._M_p + 1) {
        fmt_05.size_ = 4;
        fmt_05.data_ = (char *)0xb;
        args_05.field_1.values_ = aVar11.values_;
        args_05.desc_ = (unsigned_long_long)lengthAndOffset;
        lengthAndOffset[0].
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_payload._0_8_ = _Var13._M_p;
        ::fmt::v10::vformat_abi_cxx11_((string *)local_a8,(v10 *)"Sample {}:\n",fmt_05,args_05);
        PrintDiff::updateContext(diff,(string *)local_a8);
        std::__cxx11::string::~string((string *)local_a8);
        samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
        super__Optional_payload_base<ktx::SampleType>._16_4_ =
             samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
             super__Optional_payload_base<ktx::SampleType>._16_4_ & 0xffffff00;
        samples[1].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
        super__Optional_payload_base<ktx::SampleType>._M_engaged = false;
        poVar7 = bdfdSamples;
        for (lVar9 = 0x10; lVar9 != 0x38; lVar9 = lVar9 + 0x14) {
          if (((poVar7->
               super__Optional_base<std::vector<ktx::SampleType,_std::allocator<ktx::SampleType>_>,_false,_false>
               )._M_payload.
               super__Optional_payload<std::vector<ktx::SampleType,_std::allocator<ktx::SampleType>_>,_true,_false,_false>
               .
               super__Optional_payload_base<std::vector<ktx::SampleType,_std::allocator<ktx::SampleType>_>_>
               ._M_engaged == true) &&
             (lVar3 = *(long *)&(poVar7->
                                super__Optional_base<std::vector<ktx::SampleType,_std::allocator<ktx::SampleType>_>,_false,_false>
                                )._M_payload.
                                super__Optional_payload<std::vector<ktx::SampleType,_std::allocator<ktx::SampleType>_>,_true,_false,_false>
                                .
                                super__Optional_payload_base<std::vector<ktx::SampleType,_std::allocator<ktx::SampleType>_>_>
                                ._M_payload._M_value.
                                super__Vector_base<ktx::SampleType,_std::allocator<ktx::SampleType>_>
                                ._M_impl,
             _Var13._M_p <
             (pointer)((long)*(pointer *)
                              ((long)&(poVar7->
                                      super__Optional_base<std::vector<ktx::SampleType,_std::allocator<ktx::SampleType>_>,_false,_false>
                                      )._M_payload.
                                      super__Optional_payload<std::vector<ktx::SampleType,_std::allocator<ktx::SampleType>_>,_true,_false,_false>
                                      .
                                      super__Optional_payload_base<std::vector<ktx::SampleType,_std::allocator<ktx::SampleType>_>_>
                                      ._M_payload._M_value.
                                      super__Vector_base<ktx::SampleType,_std::allocator<ktx::SampleType>_>
                                      ._M_impl + 8) - lVar3 >> 4))) {
            puVar1 = (undefined8 *)(lVar3 + (long)_Var13._M_p * 0x10);
            uVar2 = puVar1[1];
            *(undefined8 *)((long)samples + lVar9 + -0x10) = *puVar1;
            *(undefined8 *)((long)samples + lVar9 + -8) = uVar2;
            if (*(char *)((long)&samples[0].super__Optional_base<ktx::SampleType,_true,_true>.
                                 _M_payload.super__Optional_payload_base<ktx::SampleType>._M_payload
                         + lVar9) == '\0') {
              *(undefined1 *)
               ((long)&samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
                       super__Optional_payload_base<ktx::SampleType>._M_payload + lVar9) = 1;
            }
          }
          poVar7 = poVar7 + 1;
        }
        qualifierFlags[0].super__Optional_base<unsigned_int,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_int>._M_engaged = false;
        qualifierFlags[1].super__Optional_base<unsigned_int,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_int>._M_engaged = false;
        pbVar8 = &samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
                  super__Optional_payload_base<ktx::SampleType>._M_engaged;
        for (lVar9 = 0; lVar9 != 2; lVar9 = lVar9 + 1) {
          if (*pbVar8 == true) {
            qualifierFlags[lVar9].super__Optional_base<unsigned_int,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_int> =
                 (_Optional_payload_base<unsigned_int>)
                 ((ulong)(pbVar8[-0xd] & 0xfffffff0) | 0x100000000);
          }
          pbVar8 = pbVar8 + 0x14;
        }
        lengthAndOffset[0].
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_payload._M_value._M_dataplus._M_p = local_120._M_p;
        fmt_06.size_ = 0x42;
        fmt_06.data_ = (char *)0x35;
        args_06.field_1.values_ = aVar11.values_;
        args_06.desc_ = (unsigned_long_long)lengthAndOffset;
        lengthAndOffset[0].
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_payload._16_8_ = _Var13._M_p;
        ::fmt::v10::vformat_abi_cxx11_
                  ((string *)local_140,
                   (v10 *)"/dataFormatDescriptor/blocks/{}/samples/{}/qualifiers",fmt_06,args_06);
        jsonPathIn_05._M_len._4_4_ = uStack_134;
        jsonPathIn_05._M_len._0_4_ = local_138;
        aVar11.values_ =
             (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)qualifierFlags;
        textHeaderIn_05._M_str = "    Qualifiers";
        textHeaderIn_05._M_len = 0xe;
        jsonPathIn_05._M_str = (char *)local_140;
        DiffFlags::DiffFlags
                  ((DiffFlags *)local_a8,textHeaderIn_05,jsonPathIn_05,
                   (optional<unsigned_int> *)aVar11.values_,qualifierFlags + 1,
                   dfdToStringSampleDatatypeQualifiersBit);
        PrintDiff::operator<<(diff,(DiffBase<unsigned_int> *)local_a8);
        std::__cxx11::string::~string((string *)local_140);
        lengthAndOffset[0].
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_payload._M_value._M_dataplus._M_p = local_120._M_p;
        fmt_07.size_ = 0x42;
        fmt_07.data_ = (char *)0x36;
        args_07.field_1.values_ = aVar11.values_;
        args_07.desc_ = (unsigned_long_long)lengthAndOffset;
        lengthAndOffset[0].
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_payload._16_8_ = _Var13._M_p;
        ::fmt::v10::vformat_abi_cxx11_
                  ((string *)local_140,
                   (v10 *)"/dataFormatDescriptor/blocks/{}/samples/{}/channelType",fmt_07,args_07);
        if (samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
            super__Optional_payload_base<ktx::SampleType>._M_engaged == true) {
          local_15c._0_4_ =
               (byte)samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
                     super__Optional_payload_base<ktx::SampleType>._M_payload._3_1_ & 0xf;
        }
        jsonPathIn_06._M_len._4_4_ = uStack_134;
        jsonPathIn_06._M_len._0_4_ = local_138;
        local_15c[4] = samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
                       super__Optional_payload_base<ktx::SampleType>._M_engaged == true;
        local_bc = samples[1].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
                   super__Optional_payload_base<ktx::SampleType>._M_engaged == true;
        if ((bool)local_bc) {
          local_c0._M_value =
               (byte)samples[1].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
                     super__Optional_payload_base<ktx::SampleType>._M_payload._3_1_ & 0xf;
        }
        lengthAndOffset[0].
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_payload._0_8_ = &bdfds_local;
        lengthAndOffset[0].
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_payload._8_8_ = samples;
        lengthAndOffset[0].
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_payload._24_8_ =
             std::
             _Function_handler<const_char_*(unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_compare.cpp:1745:13)>
             ::_M_invoke;
        lengthAndOffset[0].
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_payload._16_8_ =
             std::
             _Function_handler<const_char_*(unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_compare.cpp:1745:13)>
             ::_M_manager;
        aVar11.values_ =
             (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)local_15c;
        textHeaderIn_06._M_str = "    Channel Type";
        textHeaderIn_06._M_len = 0x10;
        jsonPathIn_06._M_str = (char *)local_140;
        DiffEnum<_khr_df_model_channels_e>::DiffEnum
                  ((DiffEnum<_khr_df_model_channels_e> *)local_a8,textHeaderIn_06,jsonPathIn_06,
                   (optional<int> *)aVar11.values_,(optional<int> *)&local_c0,
                   (function<const_char_*(unsigned_long)> *)lengthAndOffset);
        local_a8[0x39] = true;
        PrintDiff::operator<<(diff,(DiffBase<_khr_df_model_channels_e> *)local_a8);
        std::_Function_base::~_Function_base((_Function_base *)lengthAndOffset);
        std::__cxx11::string::~string((string *)local_140);
        if ((this->options).super_OptionsFormat.format == text) {
          lengthAndOffset[0].
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_engaged = false;
          lengthAndOffset[1].
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_engaged = false;
          this_00.values_ =
               (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)lengthAndOffset;
          for (lVar9 = 0x10; lVar9 != 0x38; lVar9 = lVar9 + 0x14) {
            if (*(char *)((long)&samples[0].super__Optional_base<ktx::SampleType,_true,_true>.
                                 _M_payload.super__Optional_payload_base<ktx::SampleType>._M_payload
                         + lVar9) == '\x01') {
              uVar4 = *(ulong *)((long)samples + lVar9 + -0x10);
              local_a8._16_8_ = uVar4 & 0xffff;
              local_a8._0_8_ = (uVar4 >> 0x10 & 0xff) + 1;
              fmt_09.size_ = 0x22;
              fmt_09.data_ = (char *)0x1e;
              args_09.field_1.values_ = aVar11.values_;
              args_09.desc_ = (unsigned_long_long)local_a8;
              ::fmt::v10::vformat_abi_cxx11_
                        ((string *)local_140,(v10 *)"    Length: {} bits Offset: {}",fmt_09,args_09)
              ;
              std::optional<std::__cxx11::string>::operator=
                        ((optional<std::__cxx11::string> *)this_00.values_,(string *)local_140);
              std::__cxx11::string::~string((string *)local_140);
            }
            this_00.values_ =
                 (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)
                 ((long)&(((function<const_char_*(unsigned_long)> *)(this_00.values_ + 2))->
                         super__Function_base)._M_functor + 8);
          }
          DiffTextCustom::DiffTextCustom
                    ((DiffTextCustom *)local_a8,lengthAndOffset,lengthAndOffset + 1);
          diff = local_40;
          PrintDiff::operator<<(local_40,(DiffTextCustom *)local_a8);
          DiffTextCustom::~DiffTextCustom((DiffTextCustom *)local_a8);
          lVar9 = 0x28;
          do {
            std::
            _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)((long)&lengthAndOffset[0].
                                  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                  ._M_payload.
                                  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                  .
                                  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ._M_payload + lVar9));
            lVar9 = lVar9 + -0x28;
            bdfdSamples = local_48;
          } while (lVar9 != -0x28);
        }
        else {
          lengthAndOffset[0].
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_payload._M_value._M_dataplus._M_p = local_120._M_p;
          fmt_08.size_ = 0x42;
          fmt_08.data_ = (char *)0x34;
          args_08.field_1.values_ = aVar11.values_;
          args_08.desc_ = (unsigned_long_long)lengthAndOffset;
          lengthAndOffset[0].
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_payload._16_8_ = _Var13._M_p;
          ::fmt::v10::vformat_abi_cxx11_
                    ((string *)local_140,
                     (v10 *)"/dataFormatDescriptor/blocks/{}/samples/{}/bitLength",fmt_08,args_08);
          uVar2 = lengthAndOffset[0].
                  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                  ._M_payload.
                  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                  .
                  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ._M_payload._M_value._M_dataplus._M_p;
          if (samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
              super__Optional_payload_base<ktx::SampleType>._M_engaged == true) {
            lengthAndOffset[0].
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_payload._1_3_ = 0;
            lengthAndOffset[0].
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_payload._0_1_ =
                 samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
                 super__Optional_payload_base<ktx::SampleType>._M_payload._2_1_;
            lengthAndOffset[0].
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_payload._4_4_ = SUB84(uVar2,4);
          }
          jsonPathIn_07._M_len._4_4_ = uStack_134;
          jsonPathIn_07._M_len._0_4_ = local_138;
          lengthAndOffset[0].
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_payload._4_1_ =
               samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
               super__Optional_payload_base<ktx::SampleType>._M_engaged == true;
          if (samples[1].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
              super__Optional_payload_base<ktx::SampleType>._M_engaged == true) {
            local_15c._1_3_ = 0;
            local_15c[0] = samples[1].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
                           super__Optional_payload_base<ktx::SampleType>._M_payload._2_1_;
          }
          jsonPathIn_07._M_str = (char *)local_140;
          aVar11.values_ =
               (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)lengthAndOffset;
          local_15c[4] = samples[1].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
                         super__Optional_payload_base<ktx::SampleType>._M_engaged == true;
          Diff<int>::Diff((Diff<int> *)local_a8,(string_view)ZEXT816(0),jsonPathIn_07,
                          (optional<int> *)lengthAndOffset,(optional<int> *)local_15c);
          PrintDiff::operator<<(diff,(DiffBase<int> *)local_a8);
          std::__cxx11::string::~string((string *)local_140);
          lengthAndOffset[0].
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_payload._M_value._M_dataplus._M_p = local_120._M_p;
          fmt_10.size_ = 0x42;
          fmt_10.data_ = (char *)0x34;
          args_10.field_1.values_ = aVar11.values_;
          args_10.desc_ = (unsigned_long_long)lengthAndOffset;
          lengthAndOffset[0].
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_payload._16_8_ = _Var13._M_p;
          ::fmt::v10::vformat_abi_cxx11_
                    ((string *)local_140,
                     (v10 *)"/dataFormatDescriptor/blocks/{}/samples/{}/bitOffset",fmt_10,args_10);
          uVar2 = lengthAndOffset[0].
                  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                  ._M_payload.
                  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                  .
                  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ._M_payload._M_value._M_dataplus._M_p;
          if (samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
              super__Optional_payload_base<ktx::SampleType>._M_engaged == true) {
            lengthAndOffset[0].
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_payload._2_2_ = 0;
            lengthAndOffset[0].
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_payload._0_2_ =
                 samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
                 super__Optional_payload_base<ktx::SampleType>._M_payload._0_2_;
            lengthAndOffset[0].
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_payload._4_4_ = SUB84(uVar2,4);
          }
          jsonPathIn_08._M_len._4_4_ = uStack_134;
          jsonPathIn_08._M_len._0_4_ = local_138;
          lengthAndOffset[0].
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_payload._4_1_ =
               samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
               super__Optional_payload_base<ktx::SampleType>._M_engaged == true;
          if (samples[1].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
              super__Optional_payload_base<ktx::SampleType>._M_engaged == true) {
            local_15c._2_2_ = 0;
            local_15c._0_2_ =
                 samples[1].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
                 super__Optional_payload_base<ktx::SampleType>._M_payload._0_2_;
          }
          local_15c[4] = samples[1].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
                         super__Optional_payload_base<ktx::SampleType>._M_engaged == true;
          jsonPathIn_08._M_str = (char *)local_140;
          aVar11.values_ =
               (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)lengthAndOffset;
          Diff<int>::Diff((Diff<int> *)local_a8,(string_view)ZEXT816(0),jsonPathIn_08,
                          (optional<int> *)lengthAndOffset,(optional<int> *)local_15c);
          PrintDiff::operator<<(diff,(DiffBase<int> *)local_a8);
          std::__cxx11::string::~string((string *)local_140);
        }
        lengthAndOffset[0].
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_payload._M_value._M_dataplus._M_p = local_120._M_p;
        fmt_11.size_ = 0x42;
        fmt_11.data_ = (char *)0x39;
        args_11.field_1.values_ = aVar11.values_;
        args_11.desc_ = (unsigned_long_long)lengthAndOffset;
        lengthAndOffset[0].
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_payload._16_8_ = _Var13._M_p;
        ::fmt::v10::vformat_abi_cxx11_
                  ((string *)local_140,
                   (v10 *)"/dataFormatDescriptor/blocks/{}/samples/{}/samplePosition",fmt_11,args_11
                  );
        jsonPathIn_09._M_len._4_4_ = uStack_134;
        jsonPathIn_09._M_len._0_4_ = local_138;
        if (samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
            super__Optional_payload_base<ktx::SampleType>._M_engaged == true) {
          uVar10 = (uint)((ulong)samples[0].super__Optional_base<ktx::SampleType,_true,_true>.
                                 _M_payload.super__Optional_payload_base<ktx::SampleType>._M_payload
                                 ._0_8_ >> 0x20);
          lengthAndOffset[0].
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_payload._M_value._M_dataplus._M_p = CONCAT44(uVar10 >> 8,uVar10) & 0xff000000ff;
          lengthAndOffset[0].
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_payload._M_value._M_string_length._5_3_ = 0;
          lengthAndOffset[0].
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_payload._M_value._M_string_length._0_5_ =
               CONCAT14((char)((ulong)samples[0].super__Optional_base<ktx::SampleType,_true,_true>.
                                      _M_payload.super__Optional_payload_base<ktx::SampleType>.
                                      _M_payload._0_8_ >> 0x38),
                        (uint)(ushort)((ulong)samples[0].
                                              super__Optional_base<ktx::SampleType,_true,_true>.
                                              _M_payload.
                                              super__Optional_payload_base<ktx::SampleType>.
                                              _M_payload._0_8_ >> 0x30)) & 0xff000000ff;
        }
        lengthAndOffset[0].
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_payload._16_1_ =
             samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
             super__Optional_payload_base<ktx::SampleType>._M_engaged == true;
        local_14c = samples[1].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
                    super__Optional_payload_base<ktx::SampleType>._M_engaged == true;
        if (local_14c) {
          local_15c._0_4_ =
               samples[1].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
               super__Optional_payload_base<ktx::SampleType>._M_payload._4_4_ & 0xff;
          local_15c._4_4_ =
               (uint)samples[1].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
                     super__Optional_payload_base<ktx::SampleType>._M_payload._4_4_ >> 8 & 0xff;
          local_15c._8_4_ =
               (uint)samples[1].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
                     super__Optional_payload_base<ktx::SampleType>._M_payload._4_4_ >> 0x10 & 0xff;
          local_15c._12_4_ =
               (uint)samples[1].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
                     super__Optional_payload_base<ktx::SampleType>._M_payload._4_4_ >> 0x18;
        }
        textHeaderIn_07._M_str = "    Position";
        textHeaderIn_07._M_len = 0xc;
        jsonPathIn_09._M_str = (char *)local_140;
        aVar11.values_ =
             (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)lengthAndOffset;
        DiffArray<unsigned_int,_4UL>::DiffArray
                  ((DiffArray<unsigned_int,_4UL> *)local_a8,textHeaderIn_07,jsonPathIn_09,
                   (optional<std::array<unsigned_int,_4UL>_> *)lengthAndOffset,
                   (optional<std::array<unsigned_int,_4UL>_> *)local_15c);
        PrintDiff::operator<<(diff,(DiffBase<std::array<unsigned_int,_4UL>_> *)local_a8);
        std::__cxx11::string::~string((string *)local_140);
        lengthAndOffset[0].
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_payload._M_value._M_dataplus._M_p = local_120._M_p;
        fmt_12.size_ = 0x42;
        fmt_12.data_ = (char *)0x36;
        args_12.field_1.values_ = aVar11.values_;
        args_12.desc_ = (unsigned_long_long)lengthAndOffset;
        lengthAndOffset[0].
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_payload._16_8_ = _Var13._M_p;
        ::fmt::v10::vformat_abi_cxx11_
                  ((string *)local_140,
                   (v10 *)"/dataFormatDescriptor/blocks/{}/samples/{}/sampleLower",fmt_12,args_12);
        if (samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
            super__Optional_payload_base<ktx::SampleType>._M_engaged == true) {
          lengthAndOffset[0].
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_payload._0_4_ =
               samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
               super__Optional_payload_base<ktx::SampleType>._M_payload._M_value.lower;
        }
        jsonPathIn_10._M_len._4_4_ = uStack_134;
        jsonPathIn_10._M_len._0_4_ = local_138;
        lengthAndOffset[0].
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_payload._4_1_ =
             samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
             super__Optional_payload_base<ktx::SampleType>._M_engaged == true;
        if (samples[1].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
            super__Optional_payload_base<ktx::SampleType>._M_engaged == true) {
          local_15c._0_4_ =
               samples[1].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
               super__Optional_payload_base<ktx::SampleType>._M_payload._M_value.lower;
        }
        textHeaderIn_08._M_str = "    Lower";
        textHeaderIn_08._M_len = 9;
        jsonPathIn_10._M_str = (char *)local_140;
        aVar11.values_ =
             (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)lengthAndOffset;
        local_15c[4] = samples[1].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
                       super__Optional_payload_base<ktx::SampleType>._M_engaged == true;
        DiffHexFixedWidth<unsigned_int>::DiffHexFixedWidth
                  ((DiffHexFixedWidth<unsigned_int> *)local_a8,textHeaderIn_08,jsonPathIn_10,
                   (optional<unsigned_int> *)lengthAndOffset,(optional<unsigned_int> *)local_15c);
        PrintDiff::operator<<(diff,(DiffBase<unsigned_int> *)local_a8);
        std::__cxx11::string::~string((string *)local_140);
        lengthAndOffset[0].
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_payload._M_value._M_dataplus._M_p = local_120._M_p;
        fmt_13.size_ = 0x42;
        fmt_13.data_ = (char *)0x36;
        args_13.field_1.values_ = aVar11.values_;
        args_13.desc_ = (unsigned_long_long)lengthAndOffset;
        lengthAndOffset[0].
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_payload._16_8_ = _Var13._M_p;
        ::fmt::v10::vformat_abi_cxx11_
                  ((string *)local_140,
                   (v10 *)"/dataFormatDescriptor/blocks/{}/samples/{}/sampleUpper",fmt_13,args_13);
        if (samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
            super__Optional_payload_base<ktx::SampleType>._M_engaged == true) {
          lengthAndOffset[0].
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_payload._0_4_ =
               samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
               super__Optional_payload_base<ktx::SampleType>._M_payload._M_value.upper;
        }
        jsonPathIn_11._M_len._4_4_ = uStack_134;
        jsonPathIn_11._M_len._0_4_ = local_138;
        lengthAndOffset[0].
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_payload._4_1_ =
             samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
             super__Optional_payload_base<ktx::SampleType>._M_engaged == true;
        if (samples[1].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
            super__Optional_payload_base<ktx::SampleType>._M_engaged == true) {
          local_15c._0_4_ =
               samples[1].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
               super__Optional_payload_base<ktx::SampleType>._M_payload._M_value.upper;
        }
        local_15c[4] = samples[1].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
                       super__Optional_payload_base<ktx::SampleType>._M_engaged == true;
        textHeaderIn_09._M_str = "    Upper";
        textHeaderIn_09._M_len = 9;
        jsonPathIn_11._M_str = (char *)local_140;
        aVar11.values_ =
             (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)lengthAndOffset;
        DiffHexFixedWidth<unsigned_int>::DiffHexFixedWidth
                  ((DiffHexFixedWidth<unsigned_int> *)local_a8,textHeaderIn_09,jsonPathIn_11,
                   (optional<unsigned_int> *)lengthAndOffset,(optional<unsigned_int> *)local_15c);
        PrintDiff::operator<<(diff,(DiffBase<unsigned_int> *)local_a8);
        std::__cxx11::string::~string((string *)local_140);
      }
    }
    return;
  }
  __assert_fail("bdfds[i].has_value() == bdfdSamples[i].has_value()",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_compare.cpp"
                ,0x691,
                "void ktx::CommandCompare::compareDFDBasic(PrintDiff &, uint32_t, std::optional<BDFD> *, std::optional<std::vector<SampleType>> *)"
               );
}

Assistant:

void CommandCompare::compareDFDBasic(PrintDiff& diff, uint32_t blockIndex,
    std::optional<BDFD> bdfds[2], std::optional<std::vector<SampleType>> bdfdSamples[2]) {
    for (std::size_t i = 0; i < 2; ++i)
        assert(bdfds[i].has_value() == bdfdSamples[i].has_value());

    if (options.ignoreDFD != IgnoreDFD::all_except_color_space)
        diff << DiffFlags("Flags",
            fmt::format("/dataFormatDescriptor/blocks/{}/flags", blockIndex),
            OPT_BITFIELDS(bdfds, flags), dfdToStringFlagsBit);

    diff << DiffEnum<khr_df_transfer_e>("Transfer",
        fmt::format("/dataFormatDescriptor/blocks/{}/transferFunction", blockIndex),
        OPT_BITFIELDS(bdfds, transfer),
        [&](auto i) { return dfdToStringTransferFunction(khr_df_transfer_e(bdfds[i]->transfer)); });
    diff << DiffEnum<khr_df_primaries_e>("Primaries",
        fmt::format("/dataFormatDescriptor/blocks/{}/colorPrimaries", blockIndex),
        OPT_BITFIELDS(bdfds, primaries),
        [&](auto i) { return dfdToStringColorPrimaries(khr_df_primaries_e(bdfds[i]->primaries)); });

    // Do not compare the remainder of the BDFD if everything but color space information is ignored
    if (options.ignoreDFD == IgnoreDFD::all_except_color_space)
        return;

    diff << DiffEnum<khr_df_model_e>("Model",
        fmt::format("/dataFormatDescriptor/blocks/{}/colorModel", blockIndex),
        OPT_BITFIELDS(bdfds, model),
        [&](auto i) { return dfdToStringColorModel(khr_df_model_e(bdfds[i]->model)); });
    diff << DiffArray("Dimensions",
        fmt::format("/dataFormatDescriptor/blocks/{}/texelBlockDimension", blockIndex),
        OPT_UINT4S(bdfds, texelBlockDimension));

    if (!options.ignoreBDFDBytesPlane)
        diff << DiffArray("Plane bytes",
            fmt::format("/dataFormatDescriptor/blocks/{}/bytesPlane", blockIndex),
            OPT_FIELDS(bdfds, bytesPlanes));

    diff.addContext("Sample <i>:\n");

    std::size_t maxNumSamples = std::max(
        bdfdSamples[0].has_value() ? bdfdSamples[0]->size() : 0,
        bdfdSamples[1].has_value() ? bdfdSamples[1]->size() : 0
    );
    for (std::size_t sampleIndex = 0; sampleIndex < maxNumSamples; ++sampleIndex) {
        diff.updateContext(fmt::format("Sample {}:\n", sampleIndex));

        std::optional<SampleType> samples[2] = {};
        for (std::size_t i = 0; i < 2; ++i)
            if (bdfdSamples[i].has_value() && sampleIndex < bdfdSamples[i]->size())
                samples[i] = (*bdfdSamples[i])[sampleIndex];

        std::optional<uint32_t> qualifierFlags[2] = {};
        for (std::size_t i = 0; i < 2; ++i)
            if (samples[i].has_value()) {
                uint32_t flags = 0;
                flags |= samples[i]->qualifierLinear ? KHR_DF_SAMPLE_DATATYPE_LINEAR : 0;
                flags |= samples[i]->qualifierExponent ? KHR_DF_SAMPLE_DATATYPE_EXPONENT : 0;
                flags |= samples[i]->qualifierSigned ? KHR_DF_SAMPLE_DATATYPE_SIGNED : 0;
                flags |= samples[i]->qualifierFloat ? KHR_DF_SAMPLE_DATATYPE_FLOAT : 0;
                qualifierFlags[i] = flags;
            }
        diff << DiffFlags("    Qualifiers",
            fmt::format("/dataFormatDescriptor/blocks/{}/samples/{}/qualifiers", blockIndex, sampleIndex),
            qualifierFlags[0], qualifierFlags[1], dfdToStringSampleDatatypeQualifiersBit);

        diff << DiffEnum<khr_df_model_channels_e>("    Channel Type",
            fmt::format("/dataFormatDescriptor/blocks/{}/samples/{}/channelType", blockIndex, sampleIndex),
            OPT_BITFIELDS(samples, channelType),
            [&](auto i) {
                return dfdToStringChannelId(khr_df_model_e(bdfds[i]->model),
                    khr_df_model_channels_e(samples[i]->channelType));
            })
            .outputHexInText();

        // Text output combines length and offset so we have to special-case here
        if (options.format == OutputFormat::text) {
            std::optional<std::string> lengthAndOffset[2] = {};
            for (std::size_t i = 0; i < 2; ++i)
                if (samples[i].has_value())
                    lengthAndOffset[i] = fmt::format("    Length: {} bits Offset: {}",
                        static_cast<uint32_t>(samples[i]->bitLength + 1),
                        static_cast<uint32_t>(samples[i]->bitOffset));
            diff << DiffTextCustom(lengthAndOffset[0], lengthAndOffset[1]);
        } else {
            diff << Diff({},
                fmt::format("/dataFormatDescriptor/blocks/{}/samples/{}/bitLength", blockIndex, sampleIndex),
                OPT_BITFIELDS(samples, bitLength));
            diff << Diff({},
                fmt::format("/dataFormatDescriptor/blocks/{}/samples/{}/bitOffset", blockIndex, sampleIndex),
                OPT_BITFIELDS(samples, bitOffset));
        }

        diff << DiffArray("    Position",
            fmt::format("/dataFormatDescriptor/blocks/{}/samples/{}/samplePosition", blockIndex, sampleIndex),
            OPT_UINT4S(samples, samplePosition));
        diff << DiffHexFixedWidth("    Lower",
            fmt::format("/dataFormatDescriptor/blocks/{}/samples/{}/sampleLower", blockIndex, sampleIndex),
            OPT_FIELDS(samples, lower));
        diff << DiffHexFixedWidth("    Upper",
            fmt::format("/dataFormatDescriptor/blocks/{}/samples/{}/sampleUpper", blockIndex, sampleIndex),
            OPT_FIELDS(samples, upper));
    }
}